

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O1

int https_connect(HTTP_INFO *hi,char *host,char *port)

{
  mbedtls_entropy_context *ctx;
  mbedtls_ctr_drbg_context *ctx_00;
  mbedtls_x509_crt *chain;
  mbedtls_ssl_config *conf;
  mbedtls_ssl_context *pmVar1;
  mbedtls_net_context *ctx_01;
  BOOL BVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  int *piVar8;
  addrinfo *paVar9;
  int fd;
  int opt;
  addrinfo *addr_list;
  socklen_t slen;
  timeval tv;
  int local_10c;
  addrinfo *local_108;
  socklen_t local_fc;
  timeval local_f8;
  fd_set local_e8;
  addrinfo local_68;
  
  BVar2 = (hi->url).https;
  if (BVar2 == '\x01') {
    ctx = &(hi->tls).entropy;
    mbedtls_entropy_init(ctx);
    ctx_00 = &(hi->tls).ctr_drbg;
    iVar3 = mbedtls_ctr_drbg_seed(ctx_00,mbedtls_entropy_func,ctx,(uchar *)0x0,0);
    if (iVar3 != 0) {
      return iVar3;
    }
    ca_crt_rsa[0x112e0] = '\0';
    chain = &(hi->tls).cacert;
    iVar3 = mbedtls_x509_crt_parse(chain,(uchar *)ca_crt_rsa,0x112e1);
    if (iVar3 != 0) {
      return iVar3;
    }
    conf = &(hi->tls).conf;
    iVar3 = mbedtls_ssl_config_defaults(conf,0,0,0);
    if (iVar3 != 0) {
      return iVar3;
    }
    mbedtls_ssl_conf_authmode(conf,1);
    mbedtls_ssl_conf_ca_chain(conf,chain,(mbedtls_x509_crl *)0x0);
    mbedtls_ssl_conf_rng(conf,mbedtls_ctr_drbg_random,ctx_00);
    mbedtls_ssl_conf_read_timeout(conf,5000);
    pmVar1 = &(hi->tls).ssl;
    iVar3 = mbedtls_ssl_setup(pmVar1,conf);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = mbedtls_ssl_set_hostname(pmVar1,host);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  ctx_01 = &(hi->tls).ssl_fd;
  signal(0xd,(__sighandler_t)0x1);
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 6;
  iVar3 = getaddrinfo(host,port,&local_68,&local_108);
  uVar6 = 0xffffffae;
  paVar9 = local_108;
  if (iVar3 != 0) goto LAB_00111021;
  for (; paVar9 != (addrinfo *)0x0; paVar9 = paVar9->ai_next) {
    iVar3 = socket(paVar9->ai_family,paVar9->ai_socktype,paVar9->ai_protocol);
    ctx_01->fd = iVar3;
    if (iVar3 < 0) {
      uVar6 = 0xffffffbe;
    }
    else {
      iVar4 = mbedtls_net_set_nonblock(ctx_01);
      iVar3 = ctx_01->fd;
      if (iVar4 < 0) goto LAB_00110fdb;
      iVar3 = connect(iVar3,paVar9->ai_addr,paVar9->ai_addrlen);
      if (iVar3 == 0) {
        uVar6 = 0;
        break;
      }
      piVar8 = __errno_location();
      iVar3 = ctx_01->fd;
      if (*piVar8 == 0x73) {
        iVar4 = iVar3 + 0x3f;
        if (-1 < iVar3) {
          iVar4 = iVar3;
        }
        goto LAB_00110f29;
      }
      close(iVar3);
      ctx_01->fd = -1;
      uVar6 = 0xffffffbc;
    }
  }
  goto LAB_00110fec;
  while (*piVar8 == 4) {
LAB_00110f29:
    local_e8.fds_bits[0xe] = 0;
    local_e8.fds_bits[0xf] = 0;
    local_e8.fds_bits[0xc] = 0;
    local_e8.fds_bits[0xd] = 0;
    local_e8.fds_bits[10] = 0;
    local_e8.fds_bits[0xb] = 0;
    local_e8.fds_bits[8] = 0;
    local_e8.fds_bits[9] = 0;
    local_e8.fds_bits[6] = 0;
    local_e8.fds_bits[7] = 0;
    local_e8.fds_bits[4] = 0;
    local_e8.fds_bits[5] = 0;
    local_e8.fds_bits[2] = 0;
    local_e8.fds_bits[3] = 0;
    local_e8.fds_bits[0] = 0;
    local_e8.fds_bits[1] = 0;
    local_e8.fds_bits[iVar4 >> 6] =
         local_e8.fds_bits[iVar4 >> 6] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
    local_f8.tv_sec = 5;
    local_f8.tv_usec = 0;
    iVar5 = select(iVar3 + 1,(fd_set *)0x0,&local_e8,(fd_set *)0x0,&local_f8);
    if (iVar5 != -1) {
      if (iVar5 == 0) goto LAB_00110fdb;
      local_fc = 4;
      iVar4 = getsockopt(iVar3,1,4,&local_10c,&local_fc);
      uVar6 = 0;
      if ((iVar4 == 0) && (0 < local_10c)) {
LAB_00110fdb:
        close(iVar3);
        ctx_01->fd = -1;
        uVar6 = 0xffffffbc;
      }
      goto LAB_00110fec;
    }
  }
  uVar6 = 0xffffffff;
LAB_00110fec:
  freeaddrinfo(local_108);
  if (uVar6 == 0) {
    iVar3 = mbedtls_net_set_block(ctx_01);
    uVar6 = 0;
    if (iVar3 < 0) {
      close(ctx_01->fd);
      ctx_01->fd = -1;
      uVar6 = 0xffffffbc;
    }
  }
LAB_00111021:
  if (uVar6 == 0) {
    if (BVar2 == '\x01') {
      pmVar1 = &(hi->tls).ssl;
      mbedtls_ssl_set_bio(pmVar1,ctx_01,mbedtls_net_send,mbedtls_net_recv,mbedtls_net_recv_timeout);
      do {
        uVar6 = mbedtls_ssl_handshake(pmVar1);
        if (uVar6 == 0) {
          if (((hi->tls).verify != '\0') &&
             (uVar7 = mbedtls_ssl_get_verify_result(pmVar1), uVar7 != 0)) {
            return -0x2700;
          }
          goto LAB_00111088;
        }
      } while ((uVar6 & 0xffffff7f) == 0xffff9700);
    }
    else {
LAB_00111088:
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

static int https_connect(HTTP_INFO *hi, char *host, char *port)
{
    int ret, https;


    https = hi->url.https;

    if(https == 1)
    {
        mbedtls_entropy_init( &hi->tls.entropy );

        ret = mbedtls_ctr_drbg_seed( &hi->tls.ctr_drbg, mbedtls_entropy_func, &hi->tls.entropy, NULL, 0);
        if( ret != 0 )
        {
            return ret;
        }

        ca_crt_rsa[ca_crt_rsa_size - 1] = 0;
        ret = mbedtls_x509_crt_parse(&hi->tls.cacert, (uint8_t *)ca_crt_rsa, ca_crt_rsa_size);
        if( ret != 0 )
        {
            return ret;
        }

        ret = mbedtls_ssl_config_defaults( &hi->tls.conf,
                                           MBEDTLS_SSL_IS_CLIENT,
                                           MBEDTLS_SSL_TRANSPORT_STREAM,
                                           MBEDTLS_SSL_PRESET_DEFAULT );
        if( ret != 0 )
        {
            return ret;
        }

        /* OPTIONAL is not optimal for security,
         * but makes interop easier in this simplified example */
        mbedtls_ssl_conf_authmode( &hi->tls.conf, MBEDTLS_SSL_VERIFY_OPTIONAL );
        mbedtls_ssl_conf_ca_chain( &hi->tls.conf, &hi->tls.cacert, NULL );
        mbedtls_ssl_conf_rng( &hi->tls.conf, mbedtls_ctr_drbg_random, &hi->tls.ctr_drbg );
        mbedtls_ssl_conf_read_timeout( &hi->tls.conf, 5000 );

        ret = mbedtls_ssl_setup( &hi->tls.ssl, &hi->tls.conf );
        if( ret != 0 )
        {
            return ret;
        }

        ret = mbedtls_ssl_set_hostname( &hi->tls.ssl, host );
        if( ret != 0 )
        {
            return ret;
        }
    }

    ret = mbedtls_net_connect_timeout(&hi->tls.ssl_fd, host, port, MBEDTLS_NET_PROTO_TCP, 5000);
    if( ret != 0 )
    {
        return ret;
    }

    if(https == 1)
    {
        mbedtls_ssl_set_bio(&hi->tls.ssl, &hi->tls.ssl_fd, mbedtls_net_send, mbedtls_net_recv, mbedtls_net_recv_timeout);

        while ((ret = mbedtls_ssl_handshake(&hi->tls.ssl)) != 0)
        {
            if (ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE)
            {
                return ret;
            }
        }

        /* In real life, we probably want to bail out when ret != 0 */
        if( hi->tls.verify && (mbedtls_ssl_get_verify_result(&hi->tls.ssl) != 0) )
        {
            return MBEDTLS_ERR_X509_CERT_VERIFY_FAILED;
        }
    }

    return 0;
}